

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keygen-noise.c
# Opt level: O2

char * get_random_data(int len,char *device)

{
  int iVar1;
  char *pcVar2;
  ssize_t sVar3;
  int *piVar4;
  char *__format;
  uint uVar5;
  long lVar6;
  FILE *__stream;
  
  pcVar2 = (char *)safemalloc((long)len,1,0);
  if (device == (char *)0x0) {
    lVar6 = 0;
    do {
      if (lVar6 == 0x10) {
        safefree(pcVar2);
        fwrite("puttygen: cannot find a readable random number source; use --random-device\n",0x4b,1
               ,_stderr);
        return (char *)0x0;
      }
      device = *(char **)((long)get_random_data::default_devices + lVar6);
      iVar1 = access(device,4);
      lVar6 = lVar6 + 8;
    } while (iVar1 != 0);
  }
  uVar5 = 0;
  iVar1 = open(device,0);
  if (iVar1 < 0) {
    safefree(pcVar2);
    __stream = _stderr;
    piVar4 = __errno_location();
    pcVar2 = strerror(*piVar4);
    __format = "puttygen: %s: open: %s\n";
  }
  else {
    do {
      if (len - uVar5 == 0 || len < (int)uVar5) {
        close(iVar1);
        return pcVar2;
      }
      sVar3 = read(iVar1,pcVar2 + uVar5,(long)(int)(len - uVar5));
      uVar5 = uVar5 + (int)sVar3;
    } while (-1 < (int)sVar3);
    close(iVar1);
    safefree(pcVar2);
    __stream = _stderr;
    piVar4 = __errno_location();
    pcVar2 = strerror(*piVar4);
    __format = "puttygen: %s: read: %s\n";
  }
  fprintf(__stream,__format,device,pcVar2);
  return (char *)0x0;
}

Assistant:

char *get_random_data(int len, const char *device)
{
    char *buf = snewn(len, char);
    int fd;
    int ngot, ret;

    if (!device) {
        static const char *const default_devices[] = {
            "/dev/urandom", "/dev/random"
        };
        size_t i;

        for (i = 0; i < lenof(default_devices); i++) {
            if (access(default_devices[i], R_OK) == 0) {
                device = default_devices[i];
                break;
            }
        }

        if (!device) {
            sfree(buf);
            fprintf(stderr, "puttygen: cannot find a readable "
                    "random number source; use --random-device\n");
            return NULL;
        }
    }

    fd = open(device, O_RDONLY);
    if (fd < 0) {
        sfree(buf);
        fprintf(stderr, "puttygen: %s: open: %s\n",
                device, strerror(errno));
        return NULL;
    }

    ngot = 0;
    while (ngot < len) {
        ret = read(fd, buf+ngot, len-ngot);
        if (ret < 0) {
            close(fd);
            sfree(buf);
            fprintf(stderr, "puttygen: %s: read: %s\n",
                    device, strerror(errno));
            return NULL;
        }
        ngot += ret;
    }

    close(fd);

    return buf;
}